

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O0

bool CompareNodeBlockTime(NodeEvictionCandidate *a,NodeEvictionCandidate *b)

{
  long lVar1;
  bool bVar2;
  strong_ordering sVar3;
  duration<long,_std::ratio<1L,_1L>_> *in_RSI;
  duration<long,_std::ratio<1L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  undefined5 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined5 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff5;
  undefined2 in_stack_fffffffffffffff6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::chrono::operator==(in_RDI,in_RSI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if (((byte)in_RDI[5].__r & 1) == ((byte)in_RSI[5].__r & 1)) {
      sVar3 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                        ((duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT26(in_stack_fffffffffffffff6,
                                  CONCAT15(in_stack_fffffffffffffff5,in_stack_fffffffffffffff0)),
                         in_RDI);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)
                 CONCAT17(in_stack_ffffffffffffffdf,
                          CONCAT16(sVar3._M_value,
                                   CONCAT15(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffd8))),
                 (__unspec *)0x1132bd2);
      bVar2 = std::operator>(sVar3._M_value);
    }
    else {
      bVar2 = (bool)((byte)in_RSI[5].__r & 1);
    }
  }
  else {
    sVar3 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                      ((duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT26(in_stack_fffffffffffffff6,
                                CONCAT15(in_stack_fffffffffffffff5,in_stack_fffffffffffffff0)),
                       in_RDI);
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)
               CONCAT17(sVar3._M_value,
                        CONCAT16(in_stack_ffffffffffffffde,
                                 CONCAT15(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffd8))),
               (__unspec *)0x1132b68);
    bVar2 = std::operator<(sVar3._M_value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool CompareNodeBlockTime(const NodeEvictionCandidate &a, const NodeEvictionCandidate &b)
{
    // There is a fall-through here because it is common for a node to have many peers which have not yet relayed a block.
    if (a.m_last_block_time != b.m_last_block_time) return a.m_last_block_time < b.m_last_block_time;
    if (a.fRelevantServices != b.fRelevantServices) return b.fRelevantServices;
    return a.m_connected > b.m_connected;
}